

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O1

void libtorrent::initialize_default_settings(session_settings_single_thread *s)

{
  char *pcVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long *plVar5;
  long lVar6;
  string local_48;
  
  plVar5 = (long *)&DAT_004fef88;
  lVar6 = 0;
  do {
    if (*plVar5 != 0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,plVar5[-1],*plVar5 + plVar5[-1]);
      aux::session_settings_single_thread::set_str(s,(int)lVar6,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    lVar6 = lVar6 + 1;
    plVar5 = plVar5 + 7;
  } while (lVar6 != 0xd);
  lVar6 = 0;
  do {
    *(undefined4 *)((long)(s->m_ints)._M_elems + lVar6) = *(undefined4 *)(&DAT_004f50c0 + lVar6 * 8)
    ;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x27c);
  pcVar1 = "";
  uVar2 = 0;
  do {
    uVar3 = 1L << ((byte)uVar2 & 0x3f);
    uVar4 = uVar2 >> 6;
    if (*pcVar1 == '\x01') {
      uVar3 = uVar3 | (s->m_bools).super__Base_bitset<2UL>._M_w[uVar4];
    }
    else {
      uVar3 = ~uVar3 & (s->m_bools).super__Base_bitset<2UL>._M_w[uVar4];
    }
    (s->m_bools).super__Base_bitset<2UL>._M_w[uVar4] = uVar3;
    uVar2 = uVar2 + 1;
    pcVar1 = pcVar1 + 0x20;
  } while (uVar2 != 0x54);
  return;
}

Assistant:

void initialize_default_settings(aux::session_settings_single_thread& s)
	{
		for (int i = 0; i < settings_pack::num_string_settings; ++i)
		{
			if (str_settings[i].default_value.empty()) continue;
			s.set_str(settings_pack::string_type_base | i, str_settings[i].default_value);
			TORRENT_ASSERT(s.get_str(settings_pack::string_type_base + i) == str_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_int_settings; ++i)
		{
			s.set_int(settings_pack::int_type_base | i, int_settings[i].default_value);
			TORRENT_ASSERT(s.get_int(settings_pack::int_type_base + i) == int_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_bool_settings; ++i)
		{
			s.set_bool(settings_pack::bool_type_base | i, bool_settings[i].default_value);
			TORRENT_ASSERT(s.get_bool(settings_pack::bool_type_base + i) == bool_settings[i].default_value);
		}
	}